

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O2

__pid_t __thiscall sznet::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  
  local_20.m_mutex = &this->m_mutex;
  MutexLock::lock(local_20.m_mutex);
  while (0 < this->m_count) {
    Condition::wait(&this->m_condition,__stat_loc);
  }
  MutexLockGuard::~MutexLockGuard(&local_20);
  return extraout_EAX;
}

Assistant:

void CountDownLatch::wait()
{
	MutexLockGuard lock(m_mutex);
	while (m_count > 0)
	{
		m_condition.wait();
	}
}